

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestAssertHandler.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_182c::TestReportAssertSetsCorrectInfoInException::RunImpl
          (TestReportAssertSetsCorrectInfoInException *this)

{
  int lineNumber;
  
  UnitTest::ReportAssert("description","filename",0x3039);
  return;
}

Assistant:

TEST(ReportAssertSetsCorrectInfoInException)
{
    const int lineNumber = 12345;
    const char* description = "description";
    const char* filename = "filename";

    try
    {
        ReportAssert(description, filename, lineNumber);
    }
    catch(AssertException const& e)
    {
        CHECK_EQUAL(description, e.what());
        CHECK_EQUAL(filename, e.Filename());
        CHECK_EQUAL(lineNumber, e.LineNumber());
    }
}